

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O1

void sznet::net::sockets::sz_fromipport(char *ip,uint16_t port,sockaddr_in *addr)

{
  in_port_t iVar1;
  int iVar2;
  SourceFile file;
  Logger local_fd8;
  
  addr->sin_family = 2;
  iVar1 = swap_bytes(port);
  addr->sin_port = iVar1;
  iVar2 = inet_pton(2,ip,&addr->sin_addr);
  if (iVar2 < 1) {
    file._8_8_ = 0xe;
    file.m_data = "SocketsOps.cpp";
    Logger::Logger(&local_fd8,file,0xc9,false);
    if (0x16 < (uint)(((int)&local_fd8 + 0xfb0) - (int)local_fd8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fd8.m_impl.m_stream.m_buffer.m_cur,"sockets::sz_fromipport",0x16);
      local_fd8.m_impl.m_stream.m_buffer.m_cur = local_fd8.m_impl.m_stream.m_buffer.m_cur + 0x16;
    }
    Logger::~Logger(&local_fd8);
  }
  return;
}

Assistant:

void sz_fromipport(const char* ip, uint16_t port, struct sockaddr_in* addr)
{
	addr->sin_family = AF_INET;
	addr->sin_port = hostToNetwork16(port);
	if (::inet_pton(AF_INET, ip, &addr->sin_addr) <= 0)
	{
		LOG_SYSERR << "sockets::sz_fromipport";
	}
}